

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

char * CVmBif::get_str_val(vm_val_t *val)

{
  int iVar1;
  CVmObject *pCVar2;
  undefined4 extraout_var;
  CVmPoolInMem *in_RDI;
  char *p;
  CVmObject *obj;
  undefined8 in_stack_ffffffffffffffe8;
  char *local_8;
  
  iVar1 = *(int *)&(in_RDI->super_CVmPoolPaged).super_CVmPool._vptr_CVmPool;
  if (iVar1 == 5) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[0x35])();
    local_8 = (char *)CONCAT44(extraout_var,iVar1);
    if (local_8 == (char *)0x0) goto LAB_002f479e;
  }
  else {
    if (iVar1 != 8) {
LAB_002f479e:
      err_throw(0);
    }
    local_8 = CVmPoolInMem::get_ptr(in_RDI,(pool_ofs_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  }
  return local_8;
}

Assistant:

const char *CVmBif::get_str_val(VMG_ const vm_val_t *val)
{
    CVmObject *obj;
    const char *p;

    /* see what we have */
    switch(val->typ)
    {
    case VM_SSTRING:
        /* it's a constant string - get the constant pool pointer */
        return G_const_pool->get_ptr(val->val.ofs);

    case VM_OBJ:
        /* get the object */
        obj = vm_objp(vmg_ val->val.obj);

        /* get the string value, if it has one */
        p = obj->get_as_string(vmg0_);

        /* if it has a string value, return it */
        if (p != 0)
            return p;

        /* we didn't get a string value */
        break;

    default:
        /* other types don't have a string value */
        break;
    }

    /* if we got here, the value isn't a string */
    err_throw(VMERR_STRING_VAL_REQD);
    AFTER_ERR_THROW(return 0;)
}